

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-set-form-values.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__s;
  QPDFAnnotationObjectHelper *pQVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  ostream *poVar5;
  char *pcVar6;
  int extraout_EDX;
  QPDFPageObjectHelper *pQVar7;
  QPDFAnnotationObjectHelper *pQVar8;
  allocator<char> local_179;
  QPDF qpdf;
  char *local_170;
  QPDFAnnotationObjectHelper *local_148;
  QPDFAnnotationObjectHelper *local_140;
  QPDFPageObjectHelper *local_130;
  QPDFPageObjectHelper *local_128;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110 [6];
  QPDFAcroFormDocumentHelper afdh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  QPDFPageObjectHelper local_a0;
  QPDFAnnotationObjectHelper local_68;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 4) {
    pcVar6 = argv[1];
    pcVar1 = argv[2];
    __s = argv[3];
    QPDF::QPDF(&qpdf);
    QPDF::processFile((char *)&qpdf,pcVar6);
    QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&afdh,&qpdf);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,&qpdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    pQVar7 = local_130;
    while( true ) {
      if (pQVar7 == local_128) break;
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_a0,pQVar7);
      QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage((QPDFPageObjectHelper *)&local_148);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_a0);
      pQVar2 = local_140;
      for (pQVar8 = local_148; pQVar8 != pQVar2; pQVar8 = pQVar8 + 1) {
        QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_68,pQVar8);
        QPDFAcroFormDocumentHelper::getFieldForAnnotation((QPDFAnnotationObjectHelper *)&w);
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
        QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_();
        bVar3 = std::operator==(&local_c0,"/Tx");
        std::__cxx11::string::~string((string *)&local_c0);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_179);
          QPDFFormFieldObjectHelper::setV((string *)&w,SUB81(&local_c0,0));
          std::__cxx11::string::~string((string *)&local_c0);
          QPDFFormFieldObjectHelper::generateAppearance((QPDFAnnotationObjectHelper *)&w);
        }
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&w);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 &local_148);
      pQVar7 = pQVar7 + 1;
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_130);
    QPDFWriter::QPDFWriter(&w,&qpdf,pcVar1);
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_110);
    QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&afdh);
    QPDF::~QPDF(&qpdf);
    return 0;
  }
  usage();
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&afdh);
  QPDF::~QPDF(&qpdf);
  if (extraout_EDX == 1) {
    plVar4 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar5 = std::operator<<((ostream *)&std::cerr,whoami);
    poVar5 = std::operator<<(poVar5," processing file ");
    poVar5 = std::operator<<(poVar5,local_170);
    poVar5 = std::operator<<(poVar5,": ");
    pcVar6 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 4) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* value = argv[3];

    // This is a contrived example that just goes through a file page by page and sets the value of
    // any text fields it finds to a fixed value as given on the command line. The purpose here is
    // to illustrate use of the helper classes around interactive forms.

    try {
        QPDF qpdf;
        qpdf.processFile(infilename);

        // We will iterate through form fields by starting at the page level and looking at each
        // field for each page. We could also call QPDFAcroFormDocumentHelper::getFormFields to
        // iterate at the field level, but doing it as below illustrates how we can map from
        // annotations to fields.

        QPDFAcroFormDocumentHelper afdh(qpdf);
        for (auto const& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all widget annotations for each page. Widget annotations are the ones that
            // contain the details of what's in a form field.
            for (auto& annot: afdh.getWidgetAnnotationsForPage(page)) {
                // For each annotation, find its associated field. If it's a text field, set its
                // value.
                QPDFFormFieldObjectHelper ffh = afdh.getFieldForAnnotation(annot);
                if (ffh.getFieldType() == "/Tx") {
                    // Set the value. Passing false as the second parameter prevents qpdf from
                    // setting /NeedAppearances to true (but will not turn it off if it's already
                    // on), so we call generateAppearance after setting the value. You may or may
                    // not want to do this depending on whether the appearance streams generated by
                    // qpdf are good enough for your purposes. For additional details, please see
                    // comments in QPDFFormFieldObjectHelper.hh for this method.
                    ffh.setV(value, false);
                    ffh.generateAppearance(annot);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        w.setStaticID(true); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}